

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqlite_class.cpp
# Opt level: O1

void __thiscall test_cpp_db_sqlite::test_result_emptys::test_method(test_result_emptys *this)

{
  bool bVar1;
  result r;
  undefined1 local_78 [8];
  string local_70;
  undefined1 local_50 [16];
  undefined1 *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  const_string local_30;
  undefined1 local_20 [16];
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"select COL1, COL2 from TEST_TABLE where col1 = ?","");
  cpp_db::statement::statement
            ((statement *)local_50,&local_70,
             (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).con.
             super___shared_ptr<cpp_db::connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  cpp_db::bind_params<char_const(&)[13]>((statement *)local_50,(char (*) [13])"empty result");
  cpp_db::statement::execute((statement *)local_78);
  cpp_db::statement::~statement((statement *)local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message,0,
             boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_message.
             _M_string_length,"",0);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0xa9;
  bVar1 = cpp_db::result::is_eof((result *)local_78);
  local_70._M_dataplus._M_p._0_1_ = bVar1;
  local_70._M_string_length = 0;
  local_70.field_2._M_allocated_capacity = 0;
  local_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_20;
  local_20._0_8_ = "r.is_eof()";
  local_20._8_8_ = "";
  local_50[8] = false;
  local_50._0_8_ = &PTR__lazy_ostream_001990b8;
  local_40 = boost::unit_test::lazy_ostream::inst;
  local_30.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_25/JohannAnhofer[P]cpp_db/tests/test_sqlite_class.cpp"
  ;
  local_30.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_70,(lazy_ostream *)local_50,&local_30,0xa9,CHECK,CHECK_PRED,
             0);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_70.field_2._M_allocated_capacity);
  cpp_db::result::~result((result *)local_78);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_result_emptys)
{
    cpp_db::result r(cpp_db::statement("select COL1, COL2 from TEST_TABLE where col1 = ?", *con).execute("empty result"));
    BOOST_CHECK(r.is_eof());

}